

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
::iterator::skip_empty(iterator *this)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *prVar1;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *prVar4;
  iterator iVar5;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_00;
  
  pcVar2 = (this->it_).ctrl_;
  pcVar3 = (this->it_end_).ctrl_;
  prVar1 = &this->inner_end_->set_;
  prVar4 = &this->inner_->set_;
  while( true ) {
    this_00 = prVar4 + 1;
    if (pcVar2 != pcVar3) {
      return;
    }
    this->inner_ = (Inner *)this_00;
    if (this_00 == prVar1) break;
    iVar5 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
            ::begin(this_00);
    pcVar2 = iVar5.ctrl_;
    (this->it_).ctrl_ = iVar5.ctrl_;
    (this->it_).field_1 = iVar5.field_1;
    pcVar3 = this_00->ctrl_ + prVar4[1].capacity_;
    (this->it_end_).ctrl_ = pcVar3;
    prVar4 = this_00;
  }
  this->inner_ = (Inner *)0x0;
  return;
}

Assistant:

void skip_empty() {
            while (it_ == it_end_) {
                ++inner_;
                if (inner_ == inner_end_) {
                    inner_ = nullptr; // marks end()
                    break;
                }
                else {
                    it_ = inner_->set_.begin();
                    it_end_ = inner_->set_.end();
                }
            }
        }